

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

STRING_HANDLE
construct_http_data(HTTP_CLIENT_REQUEST_TYPE request_type,char *relative_path,
                   STRING_HANDLE http_line)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  size_t local_d0;
  ulong local_c0;
  ulong local_a8;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *request;
  size_t malloc_size;
  size_t buffLen;
  LOGGER_LOG l;
  char *method;
  STRING_HANDLE result;
  STRING_HANDLE http_line_local;
  char *relative_path_local;
  HTTP_CLIENT_REQUEST_TYPE request_type_local;
  
  if (request_type == HTTP_CLIENT_REQUEST_GET) {
    local_78 = "GET";
  }
  else {
    if (request_type == HTTP_CLIENT_REQUEST_OPTIONS) {
      local_80 = "OPTIONS";
    }
    else {
      if (request_type == HTTP_CLIENT_REQUEST_POST) {
        local_88 = "POST";
      }
      else {
        if (request_type == HTTP_CLIENT_REQUEST_PUT) {
          local_90 = "PUT";
        }
        else {
          if (request_type == HTTP_CLIENT_REQUEST_DELETE) {
            local_98 = "DELETE";
          }
          else {
            local_98 = (char *)0x0;
            if (request_type == HTTP_CLIENT_REQUEST_PATCH) {
              local_98 = "PATCH";
            }
          }
          local_90 = local_98;
        }
        local_88 = local_90;
      }
      local_80 = local_88;
    }
    local_78 = local_80;
  }
  if (local_78 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"construct_http_data",0x3eb,1,"Invalid request method %s specified",0);
    }
    method = (char *)0x0;
  }
  else {
    sVar3 = strlen(HTTP_REQUEST_LINE_FMT);
    sVar4 = strlen(local_78);
    if (sVar3 < -sVar4 - 1) {
      sVar3 = strlen(HTTP_REQUEST_LINE_FMT);
      sVar4 = strlen(local_78);
      local_a8 = sVar3 + sVar4;
    }
    else {
      local_a8 = 0xffffffffffffffff;
    }
    sVar3 = strlen(relative_path);
    if (local_a8 < -sVar3 - 1) {
      sVar3 = strlen(relative_path);
      local_c0 = local_a8 + sVar3;
    }
    else {
      local_c0 = 0xffffffffffffffff;
    }
    if (local_c0 < 0xfffffffffffffffe) {
      local_d0 = local_c0 + 1;
    }
    else {
      local_d0 = 0xffffffffffffffff;
    }
    if ((local_d0 == 0xffffffffffffffff) || (__s = (char *)malloc(local_d0), __s == (char *)0x0)) {
      method = (char *)0x0;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"construct_http_data",0x3f9,1,"Failure allocating Request data, size:%zu",
                  local_d0);
      }
    }
    else {
      iVar1 = snprintf(__s,local_d0,HTTP_REQUEST_LINE_FMT,local_78,relative_path);
      if (iVar1 < 1) {
        method = (char *)0x0;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"construct_http_data",0x400,1,"Failure writing request buffer");
        }
      }
      else {
        method = (char *)STRING_construct(__s);
        if ((STRING_HANDLE)method == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_data",0x407,1,"Failure creating buffer object");
          }
        }
        else {
          iVar1 = STRING_concat_with_STRING((STRING_HANDLE)method,http_line);
          if (iVar1 != 0) {
            STRING_delete((STRING_HANDLE)method);
            method = (char *)0x0;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"construct_http_data",0x40d,1,"Failure writing request buffers");
            }
          }
        }
      }
      free(__s);
    }
  }
  return (STRING_HANDLE)method;
}

Assistant:

static STRING_HANDLE construct_http_data(HTTP_CLIENT_REQUEST_TYPE request_type, const char* relative_path, STRING_HANDLE http_line)
{
    STRING_HANDLE result;

    const char* method = (request_type == HTTP_CLIENT_REQUEST_GET) ? "GET"
        : (request_type == HTTP_CLIENT_REQUEST_OPTIONS) ? "OPTIONS"
        : (request_type == HTTP_CLIENT_REQUEST_POST) ? "POST"
        : (request_type == HTTP_CLIENT_REQUEST_PUT) ? "PUT"
        : (request_type == HTTP_CLIENT_REQUEST_DELETE) ? "DELETE"
        : (request_type == HTTP_CLIENT_REQUEST_PATCH) ? "PATCH"
        : NULL;
    /* Codes_SRS_UHTTP_07_014: [If the request_type is not a valid request http_client_execute_request shall return HTTP_CLIENT_ERROR] */
    if (method == NULL)
    {
        LogError("Invalid request method %s specified", method);
        result = NULL;
    }
    else
    {
        size_t buffLen = safe_add_size_t(strlen(HTTP_REQUEST_LINE_FMT), strlen(method));
        buffLen = safe_add_size_t(buffLen, strlen(relative_path));

        size_t malloc_size = safe_add_size_t(buffLen, 1);
        char* request;
        if (malloc_size == SIZE_MAX ||
            (request = malloc(malloc_size)) == NULL)
        {
            result = NULL;
            LogError("Failure allocating Request data, size:%zu", malloc_size);
        }
        else
        {
            if (snprintf(request, malloc_size, HTTP_REQUEST_LINE_FMT, method, relative_path) <= 0)
            {
                result = NULL;
                LogError("Failure writing request buffer");
            }
            else
            {
                result = STRING_construct(request);
                if (result == NULL)
                {
                    LogError("Failure creating buffer object");
                }
                else if (STRING_concat_with_STRING(result, http_line) != 0)
                {
                    STRING_delete(result);
                    result = NULL;
                    LogError("Failure writing request buffers");
                }
            }
            free(request);
        }
    }
    return result;
}